

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cross_entropy_loss_test.cc
# Opt level: O0

void __thiscall
xLearn::CROSS_ENTROPY_LOSS_Evaluate_Test::~CROSS_ENTROPY_LOSS_Evaluate_Test
          (CROSS_ENTROPY_LOSS_Evaluate_Test *this)

{
  void *in_RDI;
  
  ~CROSS_ENTROPY_LOSS_Evaluate_Test((CROSS_ENTROPY_LOSS_Evaluate_Test *)0x185f88);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(CROSS_ENTROPY_LOSS, Evaluate) {
  // Create pred vector
  std::vector<real_t> pred(kLine);
  for (int i = 0; i < pred.size(); ++i) {
    pred[i] = 10000;
  }
  // Create label vector
  std::vector<real_t> label(kLine);
  for (int i = 0; i < label.size(); ++i) {
    label[i] = 1.0;
  }
  // Create loss
  CrossEntropyLoss loss;
  Score* score = new FMScore;
  size_t threadNumber = std::thread::hardware_concurrency();
  ThreadPool* pool = new ThreadPool(threadNumber);
  loss.Initialize(score, pool);
  loss.Evaluate(pred, label);
  real_t val = loss.GetLoss();
  EXPECT_LT(val, 0.000001);
  // Test2
  for (int i = 0; i < pred.size(); ++i) {
    pred[i] = -10000;
  }
  for (int i = 0; i < label.size(); ++i) {
    label[i] = -1.0;
  }
  loss.Evaluate(pred, label);
  val = loss.GetLoss();
  EXPECT_LT(val, 0.000001);
}